

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::SubdivPatch1MBIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined4 uVar6;
  ulong uVar7;
  GridSOA *pGVar8;
  RTCFilterFunctionN p_Var9;
  uint uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 (*pauVar71) [16];
  long lVar72;
  long lVar73;
  AABBNodeMB4D *node1;
  ulong uVar74;
  size_t sVar75;
  uint uVar76;
  uint uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  char *pcVar81;
  undefined1 (*pauVar82) [16];
  ulong uVar83;
  char *pcVar84;
  Geometry *pGVar85;
  ulong uVar86;
  undefined4 uVar87;
  ulong unaff_R15;
  float fVar88;
  float fVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar93 [64];
  float fVar106;
  float fVar108;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar112;
  float fVar114;
  float fVar116;
  undefined1 auVar102 [32];
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar113;
  float fVar115;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  undefined1 auVar119 [32];
  float fVar123;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar135;
  float fVar136;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar160;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar161 [16];
  float fVar166;
  undefined1 auVar162 [32];
  float fVar164;
  float fVar165;
  undefined1 auVar163 [64];
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar172 [32];
  float fVar178;
  float fVar184;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar177;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar176 [64];
  float fVar185;
  float fVar196;
  undefined1 auVar186 [24];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar190 [32];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar197;
  undefined1 auVar191 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar201;
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar202 [16];
  float fVar200;
  float fVar205;
  float fVar207;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar217;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar220;
  float fVar221;
  undefined1 auVar222 [32];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar223 [64];
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar233 [32];
  float fVar252;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int iStack_14a8;
  undefined1 local_1460 [8];
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined1 local_1440 [8];
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  undefined1 local_1420 [8];
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined1 (*local_13b0) [16];
  ulong local_13a8;
  undefined8 local_13a0;
  undefined1 auStack_1398 [8];
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  char *local_1368;
  ulong local_1360;
  ulong local_1358;
  RTCFilterFunctionNArguments local_1350;
  undefined1 local_1320 [8];
  undefined8 uStack_1318;
  undefined1 auStack_1310 [8];
  float fStack_1308;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [8];
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  undefined1 local_12c0 [8];
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined1 local_12a0 [32];
  undefined1 local_1270 [16];
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float local_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [32];
  char **local_11a0;
  undefined1 local_1180 [32];
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  float local_1140 [4];
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  RTCHitN local_1090 [16];
  undefined1 local_1080 [16];
  undefined1 local_1070 [16];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float local_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined1 local_1030 [16];
  uint local_1020;
  uint uStack_101c;
  uint uStack_1018;
  uint uStack_1014;
  uint uStack_1010;
  uint uStack_100c;
  uint uStack_1008;
  uint uStack_1004;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar155 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [24];
  undefined1 auVar173 [32];
  undefined1 auVar189 [32];
  
  pauVar82 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar87 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1210._4_4_ = uVar87;
  local_1210._0_4_ = uVar87;
  local_1210._8_4_ = uVar87;
  local_1210._12_4_ = uVar87;
  auVar163 = ZEXT1664(local_1210);
  uVar87 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1220._4_4_ = uVar87;
  local_1220._0_4_ = uVar87;
  local_1220._8_4_ = uVar87;
  local_1220._12_4_ = uVar87;
  auVar176 = ZEXT1664(local_1220);
  uVar87 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1230._4_4_ = uVar87;
  local_1230._0_4_ = uVar87;
  local_1230._8_4_ = uVar87;
  local_1230._12_4_ = uVar87;
  auVar191 = ZEXT1664(local_1230);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar79 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_13a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar78 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar86 = local_13a8 ^ 0x10;
  iVar3 = (tray->tnear).field_0.i[k];
  local_1270._4_4_ = iVar3;
  local_1270._0_4_ = iVar3;
  local_1270._8_4_ = iVar3;
  local_1270._12_4_ = iVar3;
  auVar223 = ZEXT1664(local_1270);
  iVar3 = (tray->tfar).field_0.i[k];
  auVar93 = ZEXT1664(CONCAT412(iVar3,CONCAT48(iVar3,CONCAT44(iVar3,iVar3))));
  local_13b0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  fVar164 = fVar89;
  fVar165 = fVar89;
  fVar166 = fVar89;
  fVar220 = fVar88;
  fVar107 = fVar88;
  fVar109 = fVar88;
  fVar111 = fVar94;
  fVar113 = fVar94;
  fVar115 = fVar94;
  local_1260 = fVar94;
  fStack_125c = fVar94;
  fStack_1258 = fVar94;
  fStack_1254 = fVar94;
  local_1250 = fVar88;
  fStack_124c = fVar88;
  fStack_1248 = fVar88;
  fStack_1244 = fVar88;
  local_1240 = fVar89;
  fStack_123c = fVar89;
  fStack_1238 = fVar89;
  fStack_1234 = fVar89;
  while (pauVar82 != (undefined1 (*) [16])&local_fa0) {
    pauVar71 = pauVar82 + -1;
    pauVar82 = pauVar82 + -1;
    if (*(float *)(*pauVar71 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar80 = *(ulong *)*pauVar82;
      do {
        if ((uVar80 & 8) == 0) {
          uVar74 = uVar80 & 0xfffffffffffffff0;
          fVar116 = *(float *)(ray + k * 4 + 0x70);
          auVar161._4_4_ = fVar116;
          auVar161._0_4_ = fVar116;
          auVar161._8_4_ = fVar116;
          auVar161._12_4_ = fVar116;
          pfVar2 = (float *)(uVar74 + 0x80 + uVar79);
          pfVar1 = (float *)(uVar74 + 0x20 + uVar79);
          auVar99._0_4_ = fVar116 * *pfVar2 + *pfVar1;
          auVar99._4_4_ = fVar116 * pfVar2[1] + pfVar1[1];
          auVar99._8_4_ = fVar116 * pfVar2[2] + pfVar1[2];
          auVar99._12_4_ = fVar116 * pfVar2[3] + pfVar1[3];
          auVar99 = vsubps_avx(auVar99,auVar163._0_16_);
          auVar117._0_4_ = fVar89 * auVar99._0_4_;
          auVar117._4_4_ = fVar164 * auVar99._4_4_;
          auVar117._8_4_ = fVar165 * auVar99._8_4_;
          auVar117._12_4_ = fVar166 * auVar99._12_4_;
          auVar99 = vmaxps_avx(auVar223._0_16_,auVar117);
          pfVar2 = (float *)(uVar74 + 0x80 + local_13a8);
          pfVar1 = (float *)(uVar74 + 0x20 + local_13a8);
          auVar124._0_4_ = fVar116 * *pfVar2 + *pfVar1;
          auVar124._4_4_ = fVar116 * pfVar2[1] + pfVar1[1];
          auVar124._8_4_ = fVar116 * pfVar2[2] + pfVar1[2];
          auVar124._12_4_ = fVar116 * pfVar2[3] + pfVar1[3];
          auVar117 = vsubps_avx(auVar124,auVar176._0_16_);
          auVar202._0_4_ = fVar88 * auVar117._0_4_;
          auVar202._4_4_ = fVar220 * auVar117._4_4_;
          auVar202._8_4_ = fVar107 * auVar117._8_4_;
          auVar202._12_4_ = fVar109 * auVar117._12_4_;
          pfVar2 = (float *)(uVar74 + 0x80 + uVar78);
          pfVar1 = (float *)(uVar74 + 0x20 + uVar78);
          auVar137._0_4_ = fVar116 * *pfVar2 + *pfVar1;
          auVar137._4_4_ = fVar116 * pfVar2[1] + pfVar1[1];
          auVar137._8_4_ = fVar116 * pfVar2[2] + pfVar1[2];
          auVar137._12_4_ = fVar116 * pfVar2[3] + pfVar1[3];
          auVar117 = vsubps_avx(auVar137,auVar191._0_16_);
          auVar138._0_4_ = fVar94 * auVar117._0_4_;
          auVar138._4_4_ = fVar111 * auVar117._4_4_;
          auVar138._8_4_ = fVar113 * auVar117._8_4_;
          auVar138._12_4_ = fVar115 * auVar117._12_4_;
          auVar117 = vmaxps_avx(auVar202,auVar138);
          local_1200 = vmaxps_avx(auVar99,auVar117);
          pfVar2 = (float *)(uVar74 + 0x80 + (uVar79 ^ 0x10));
          pfVar1 = (float *)(uVar74 + 0x20 + (uVar79 ^ 0x10));
          auVar125._0_4_ = fVar116 * *pfVar2 + *pfVar1;
          auVar125._4_4_ = fVar116 * pfVar2[1] + pfVar1[1];
          auVar125._8_4_ = fVar116 * pfVar2[2] + pfVar1[2];
          auVar125._12_4_ = fVar116 * pfVar2[3] + pfVar1[3];
          auVar99 = vsubps_avx(auVar125,auVar163._0_16_);
          auVar126._0_4_ = fVar89 * auVar99._0_4_;
          auVar126._4_4_ = fVar164 * auVar99._4_4_;
          auVar126._8_4_ = fVar165 * auVar99._8_4_;
          auVar126._12_4_ = fVar166 * auVar99._12_4_;
          pfVar2 = (float *)(uVar74 + 0x80 + uVar86);
          auVar99 = vminps_avx(auVar93._0_16_,auVar126);
          pfVar1 = (float *)(uVar74 + 0x20 + uVar86);
          auVar139._0_4_ = fVar116 * *pfVar2 + *pfVar1;
          auVar139._4_4_ = fVar116 * pfVar2[1] + pfVar1[1];
          auVar139._8_4_ = fVar116 * pfVar2[2] + pfVar1[2];
          auVar139._12_4_ = fVar116 * pfVar2[3] + pfVar1[3];
          auVar117 = vsubps_avx(auVar139,auVar176._0_16_);
          pfVar2 = (float *)(uVar74 + 0x80 + (uVar78 ^ 0x10));
          pfVar1 = (float *)(uVar74 + 0x20 + (uVar78 ^ 0x10));
          auVar145._0_4_ = fVar116 * *pfVar2 + *pfVar1;
          auVar145._4_4_ = fVar116 * pfVar2[1] + pfVar1[1];
          auVar145._8_4_ = fVar116 * pfVar2[2] + pfVar1[2];
          auVar145._12_4_ = fVar116 * pfVar2[3] + pfVar1[3];
          auVar140._0_4_ = fVar88 * auVar117._0_4_;
          auVar140._4_4_ = fVar220 * auVar117._4_4_;
          auVar140._8_4_ = fVar107 * auVar117._8_4_;
          auVar140._12_4_ = fVar109 * auVar117._12_4_;
          auVar117 = vsubps_avx(auVar145,auVar191._0_16_);
          auVar146._0_4_ = fVar94 * auVar117._0_4_;
          auVar146._4_4_ = fVar111 * auVar117._4_4_;
          auVar146._8_4_ = fVar113 * auVar117._8_4_;
          auVar146._12_4_ = fVar115 * auVar117._12_4_;
          auVar117 = vminps_avx(auVar140,auVar146);
          auVar99 = vminps_avx(auVar99,auVar117);
          if (((uint)uVar80 & 7) == 6) {
            auVar117 = vcmpps_avx(local_1200,auVar99,2);
            auVar99 = vcmpps_avx(*(undefined1 (*) [16])(uVar74 + 0xe0),auVar161,2);
            auVar161 = vcmpps_avx(auVar161,*(undefined1 (*) [16])(uVar74 + 0xf0),1);
            auVar99 = vandps_avx(auVar99,auVar161);
            auVar99 = vandps_avx(auVar99,auVar117);
          }
          else {
            auVar99 = vcmpps_avx(local_1200,auVar99,2);
          }
          auVar99 = vpslld_avx(auVar99,0x1f);
          uVar87 = vmovmskps_avx(auVar99);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar87);
        }
        if ((uVar80 & 8) == 0) {
          if (unaff_R15 == 0) {
            iStack_14a8 = 4;
          }
          else {
            uVar74 = uVar80 & 0xfffffffffffffff0;
            lVar11 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            iStack_14a8 = 0;
            uVar80 = *(ulong *)(uVar74 + lVar11 * 8);
            uVar83 = unaff_R15 - 1 & unaff_R15;
            if (uVar83 != 0) {
              uVar5 = *(uint *)(local_1200 + lVar11 * 4);
              lVar11 = 0;
              if (uVar83 != 0) {
                for (; (uVar83 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              uVar7 = *(ulong *)(uVar74 + lVar11 * 8);
              uVar77 = *(uint *)(local_1200 + lVar11 * 4);
              uVar83 = uVar83 - 1 & uVar83;
              if (uVar83 == 0) {
                if (uVar5 < uVar77) {
                  *(ulong *)*pauVar82 = uVar7;
                  *(uint *)(*pauVar82 + 8) = uVar77;
                  pauVar82 = pauVar82 + 1;
                }
                else {
                  *(ulong *)*pauVar82 = uVar80;
                  *(uint *)(*pauVar82 + 8) = uVar5;
                  uVar80 = uVar7;
                  pauVar82 = pauVar82 + 1;
                }
              }
              else {
                auVar100._8_8_ = 0;
                auVar100._0_8_ = uVar80;
                auVar99 = vpunpcklqdq_avx(auVar100,ZEXT416(uVar5));
                auVar118._8_8_ = 0;
                auVar118._0_8_ = uVar7;
                auVar117 = vpunpcklqdq_avx(auVar118,ZEXT416(uVar77));
                lVar11 = 0;
                if (uVar83 != 0) {
                  for (; (uVar83 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                auVar127._8_8_ = 0;
                auVar127._0_8_ = *(ulong *)(uVar74 + lVar11 * 8);
                auVar124 = vpunpcklqdq_avx(auVar127,ZEXT416(*(uint *)(local_1200 + lVar11 * 4)));
                auVar161 = vpcmpgtd_avx(auVar117,auVar99);
                uVar83 = uVar83 - 1 & uVar83;
                if (uVar83 == 0) {
                  auVar202 = vpshufd_avx(auVar161,0xaa);
                  auVar161 = vblendvps_avx(auVar117,auVar99,auVar202);
                  auVar99 = vblendvps_avx(auVar99,auVar117,auVar202);
                  auVar117 = vpcmpgtd_avx(auVar124,auVar161);
                  auVar202 = vpshufd_avx(auVar117,0xaa);
                  auVar117 = vblendvps_avx(auVar124,auVar161,auVar202);
                  auVar161 = vblendvps_avx(auVar161,auVar124,auVar202);
                  auVar124 = vpcmpgtd_avx(auVar161,auVar99);
                  auVar202 = vpshufd_avx(auVar124,0xaa);
                  auVar124 = vblendvps_avx(auVar161,auVar99,auVar202);
                  auVar99 = vblendvps_avx(auVar99,auVar161,auVar202);
                  *pauVar82 = auVar99;
                  pauVar82[1] = auVar124;
                  uVar80 = auVar117._0_8_;
                  pauVar82 = pauVar82 + 2;
                }
                else {
                  lVar11 = 0;
                  if (uVar83 != 0) {
                    for (; (uVar83 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                    }
                  }
                  auVar147._8_8_ = 0;
                  auVar147._0_8_ = *(ulong *)(uVar74 + lVar11 * 8);
                  auVar125 = vpunpcklqdq_avx(auVar147,ZEXT416(*(uint *)(local_1200 + lVar11 * 4)));
                  auVar202 = vpshufd_avx(auVar161,0xaa);
                  auVar161 = vblendvps_avx(auVar117,auVar99,auVar202);
                  auVar99 = vblendvps_avx(auVar99,auVar117,auVar202);
                  auVar117 = vpcmpgtd_avx(auVar125,auVar124);
                  auVar202 = vpshufd_avx(auVar117,0xaa);
                  auVar117 = vblendvps_avx(auVar125,auVar124,auVar202);
                  auVar124 = vblendvps_avx(auVar124,auVar125,auVar202);
                  auVar202 = vpcmpgtd_avx(auVar124,auVar99);
                  auVar125 = vpshufd_avx(auVar202,0xaa);
                  auVar202 = vblendvps_avx(auVar124,auVar99,auVar125);
                  auVar99 = vblendvps_avx(auVar99,auVar124,auVar125);
                  auVar124 = vpcmpgtd_avx(auVar117,auVar161);
                  auVar125 = vpshufd_avx(auVar124,0xaa);
                  auVar124 = vblendvps_avx(auVar117,auVar161,auVar125);
                  auVar117 = vblendvps_avx(auVar161,auVar117,auVar125);
                  auVar161 = vpcmpgtd_avx(auVar202,auVar117);
                  auVar125 = vpshufd_avx(auVar161,0xaa);
                  auVar161 = vblendvps_avx(auVar202,auVar117,auVar125);
                  auVar117 = vblendvps_avx(auVar117,auVar202,auVar125);
                  *pauVar82 = auVar99;
                  pauVar82[1] = auVar117;
                  pauVar82[2] = auVar161;
                  uVar80 = auVar124._0_8_;
                  pauVar82 = pauVar82 + 3;
                }
              }
            }
          }
        }
        else {
          iStack_14a8 = 6;
        }
      } while (iStack_14a8 == 0);
      if (iStack_14a8 == 6) {
        if (((uint)uVar80 & 0xf) == 8) {
          pGVar8 = (pre->super_Precalculations).grid;
          fVar88 = (float)(pGVar8->time_steps - 1);
          fVar89 = fVar88 * *(float *)(ray + k * 4 + 0x70);
          uVar5 = pGVar8->width;
          local_1360 = (ulong)uVar5;
          auVar99 = vroundss_avx(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89),9);
          auVar99 = vminss_avx(auVar99,ZEXT416((uint)(fVar88 + -1.0)));
          auVar161 = vmaxss_avx(ZEXT816(0) << 0x20,auVar99);
          uVar77 = pGVar8->height;
          local_1358 = (ulong)uVar77;
          lVar11 = (long)(int)auVar161._0_4_ * (ulong)pGVar8->gridBytes + (ulong)pGVar8->gridOffset;
          uVar80 = uVar80 >> 4;
          lVar72 = uVar80 * 4 + lVar11;
          lVar73 = uVar80 * 4 + lVar11 + 0x2c;
          auVar99 = *(undefined1 (*) [16])(pGVar8->data + local_1360 * 4 + lVar72 + -4);
          auVar117 = auVar99;
          if (2 < local_1358) {
            auVar117 = *(undefined1 (*) [16])(pGVar8->data + local_1360 * 8 + lVar73 + -0x30);
          }
          _local_1420 = *(undefined1 (*) [16])(pGVar8->data + uVar80 * 4 + lVar11 + -4);
          if (local_1360 == 2) {
            _local_1420 = vshufps_avx(_local_1420,_local_1420,0x54);
            auVar99 = vshufps_avx(auVar99,auVar99,0x54);
            auVar117 = vshufps_avx(auVar117,auVar117,0x54);
          }
          uVar80 = (ulong)pGVar8->dim_offset;
          pcVar81 = pGVar8->data + uVar80 * 4 + lVar72 + -4;
          auVar124 = *(undefined1 (*) [16])(pcVar81 + local_1360 * 4);
          auVar202 = auVar124;
          if (2 < uVar77) {
            auVar202 = *(undefined1 (*) [16])(pcVar81 + local_1360 * 8);
          }
          _local_1440 = *(undefined1 (*) [16])pcVar81;
          if (uVar5 == 2) {
            _local_1440 = vshufps_avx(_local_1440,_local_1440,0x54);
            auVar124 = vshufps_avx(auVar124,auVar124,0x54);
            auVar202 = vshufps_avx(auVar202,auVar202,0x54);
          }
          pcVar84 = pGVar8->data + uVar80 * 8 + lVar72 + -4;
          _local_1460 = *(undefined1 (*) [16])(pcVar84 + local_1360 * 4);
          auVar125 = _local_1460;
          if (2 < uVar77) {
            auVar125 = *(undefined1 (*) [16])(pcVar84 + local_1360 * 8);
          }
          auVar126 = *(undefined1 (*) [16])pcVar84;
          if (uVar5 == 2) {
            auVar126 = vshufps_avx(auVar126,auVar126,0x54);
            _local_1460 = vshufps_avx(_local_1460,_local_1460,0x54);
            auVar125 = vshufps_avx(auVar125,auVar125,0x54);
          }
          uVar74 = (ulong)(pGVar8->gridBytes & 0xfffffffc);
          auVar137 = *(undefined1 (*) [16])(pGVar8->data + local_1360 * 4 + uVar74 + lVar73 + -0x30)
          ;
          auVar138 = auVar137;
          if (2 < uVar77) {
            auVar138 = *(undefined1 (*) [16])
                        (pGVar8->data + local_1360 * 8 + uVar74 + lVar73 + -0x30);
          }
          auVar139 = *(undefined1 (*) [16])(pGVar8->data + uVar74 + lVar73 + -0x30);
          if (uVar5 == 2) {
            auVar139 = vshufps_avx(auVar139,auVar139,0x54);
            auVar137 = vshufps_avx(auVar137,auVar137,0x54);
            auVar138 = vshufps_avx(auVar138,auVar138,0x54);
          }
          pcVar81 = pcVar81 + uVar74;
          auVar140 = *(undefined1 (*) [16])(pcVar81 + local_1360 * 4);
          auVar145 = auVar140;
          if (2 < uVar77) {
            auVar145 = *(undefined1 (*) [16])(pcVar81 + local_1360 * 8);
          }
          local_1300._0_16_ = *(undefined1 (*) [16])pcVar81;
          if (uVar5 == 2) {
            local_1300._0_16_ = vshufps_avx(local_1300._0_16_,local_1300._0_16_,0x54);
            auVar140 = vshufps_avx(auVar140,auVar140,0x54);
            auVar145 = vshufps_avx(auVar145,auVar145,0x54);
          }
          pcVar84 = pcVar84 + uVar74;
          auVar146 = *(undefined1 (*) [16])pcVar84;
          auVar100 = *(undefined1 (*) [16])(pcVar84 + local_1360 * 4);
          auVar118 = auVar100;
          if (2 < uVar77) {
            auVar118 = *(undefined1 (*) [16])(pcVar84 + local_1360 * 8);
          }
          fVar89 = fVar89 - auVar161._0_4_;
          auVar141._16_16_ = auVar99;
          auVar141._0_16_ = _local_1420;
          auVar119._16_16_ = auVar117;
          auVar119._0_16_ = auVar99;
          auVar25 = vunpcklps_avx(auVar141,auVar119);
          auVar141 = vshufps_avx(auVar141,auVar141,0xa5);
          auVar119 = vshufps_avx(auVar119,auVar119,0x94);
          auVar128._16_16_ = auVar124;
          auVar128._0_16_ = _local_1440;
          auVar149._16_16_ = auVar202;
          auVar149._0_16_ = auVar124;
          auVar26 = vunpcklps_avx(auVar128,auVar149);
          auVar128 = vshufps_avx(auVar128,auVar128,0xa5);
          auVar149 = vshufps_avx(auVar149,auVar149,0x94);
          auVar129._16_16_ = _local_1460;
          auVar129._0_16_ = auVar126;
          auVar156._16_16_ = auVar125;
          auVar156._0_16_ = _local_1460;
          auVar27 = vunpcklps_avx(auVar129,auVar156);
          auVar129 = vshufps_avx(auVar129,auVar129,0xa5);
          auVar156 = vshufps_avx(auVar156,auVar156,0x94);
          auVar157._16_16_ = auVar137;
          auVar157._0_16_ = auVar139;
          auVar203._16_16_ = auVar138;
          auVar203._0_16_ = auVar137;
          auVar28 = vunpcklps_avx(auVar157,auVar203);
          auVar157 = vshufps_avx(auVar157,auVar157,0xa5);
          auVar203 = vshufps_avx(auVar203,auVar203,0x94);
          auVar187._16_16_ = auVar140;
          auVar187._0_16_ = local_1300._0_16_;
          auVar253._16_16_ = auVar145;
          auVar253._0_16_ = auVar140;
          auVar29 = vunpcklps_avx(auVar187,auVar253);
          auVar187 = vshufps_avx(auVar187,auVar187,0xa5);
          auVar253 = vshufps_avx(auVar253,auVar253,0x94);
          if (uVar5 == 2) {
            auVar146 = vshufps_avx(auVar146,auVar146,0x54);
            auVar100 = vshufps_avx(auVar100,auVar100,0x54);
            auVar118 = vshufps_avx(auVar118,auVar118,0x54);
          }
          auVar254._16_16_ = auVar100;
          auVar254._0_16_ = auVar146;
          auVar150._16_16_ = auVar118;
          auVar150._0_16_ = auVar100;
          auVar99 = vshufps_avx(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89),0);
          auVar117 = vshufps_avx(ZEXT416((uint)(1.0 - fVar89)),ZEXT416((uint)(1.0 - fVar89)),0);
          fVar220 = auVar99._0_4_;
          fVar107 = auVar99._4_4_;
          fVar109 = auVar99._8_4_;
          fVar111 = auVar99._12_4_;
          local_1400 = auVar25._0_4_;
          fStack_13fc = auVar25._4_4_;
          fStack_13f8 = auVar25._8_4_;
          fStack_13f4 = auVar25._12_4_;
          fStack_13f0 = auVar25._16_4_;
          fStack_13ec = auVar25._20_4_;
          fStack_13e8 = auVar25._24_4_;
          fVar94 = auVar117._0_4_;
          fVar164 = auVar117._4_4_;
          fVar165 = auVar117._8_4_;
          fVar166 = auVar117._12_4_;
          auVar90._0_4_ = fVar94 * local_1400 + fVar220 * auVar28._0_4_;
          auVar90._4_4_ = fVar164 * fStack_13fc + fVar107 * auVar28._4_4_;
          auVar90._8_4_ = fVar165 * fStack_13f8 + fVar109 * auVar28._8_4_;
          auVar90._12_4_ = fVar166 * fStack_13f4 + fVar111 * auVar28._12_4_;
          auVar90._16_4_ = fVar94 * fStack_13f0 + fVar220 * auVar28._16_4_;
          auVar90._20_4_ = fVar164 * fStack_13ec + fVar107 * auVar28._20_4_;
          auVar90._24_4_ = fVar165 * fStack_13e8 + fVar109 * auVar28._24_4_;
          auVar90._28_4_ = 0;
          auVar233._0_4_ = fVar94 * auVar26._0_4_ + fVar220 * auVar29._0_4_;
          auVar233._4_4_ = fVar164 * auVar26._4_4_ + fVar107 * auVar29._4_4_;
          auVar233._8_4_ = fVar165 * auVar26._8_4_ + fVar109 * auVar29._8_4_;
          auVar233._12_4_ = fVar166 * auVar26._12_4_ + fVar111 * auVar29._12_4_;
          auVar233._16_4_ = fVar94 * auVar26._16_4_ + fVar220 * auVar29._16_4_;
          auVar233._20_4_ = fVar164 * auVar26._20_4_ + fVar107 * auVar29._20_4_;
          auVar233._24_4_ = fVar165 * auVar26._24_4_ + fVar109 * auVar29._24_4_;
          auVar233._28_4_ = auVar26._28_4_ + 0.0;
          auVar25 = vunpcklps_avx(auVar254,auVar150);
          local_12e0._0_4_ = auVar27._0_4_;
          local_12e0._4_4_ = auVar27._4_4_;
          fStack_12d8 = auVar27._8_4_;
          fStack_12d4 = auVar27._12_4_;
          fStack_12d0 = auVar27._16_4_;
          fStack_12cc = auVar27._20_4_;
          fStack_12c8 = auVar27._24_4_;
          auVar130._0_4_ = fVar94 * (float)local_12e0._0_4_ + fVar220 * auVar25._0_4_;
          auVar130._4_4_ = fVar164 * (float)local_12e0._4_4_ + fVar107 * auVar25._4_4_;
          auVar130._8_4_ = fVar165 * fStack_12d8 + fVar109 * auVar25._8_4_;
          auVar130._12_4_ = fVar166 * fStack_12d4 + fVar111 * auVar25._12_4_;
          auVar130._16_4_ = fVar94 * fStack_12d0 + fVar220 * auVar25._16_4_;
          auVar130._20_4_ = fVar164 * fStack_12cc + fVar107 * auVar25._20_4_;
          auVar130._24_4_ = fVar165 * fStack_12c8 + fVar109 * auVar25._24_4_;
          auVar130._28_4_ = auVar28._28_4_ + auVar25._28_4_;
          local_12c0._0_4_ = auVar141._0_4_;
          local_12c0._4_4_ = auVar141._4_4_;
          fStack_12b8 = auVar141._8_4_;
          fStack_12b4 = auVar141._12_4_;
          fStack_12b0 = auVar141._16_4_;
          fStack_12ac = auVar141._20_4_;
          fStack_12a8 = auVar141._24_4_;
          auVar142._0_4_ = fVar94 * (float)local_12c0._0_4_ + fVar220 * auVar157._0_4_;
          auVar142._4_4_ = fVar164 * (float)local_12c0._4_4_ + fVar107 * auVar157._4_4_;
          auVar142._8_4_ = fVar165 * fStack_12b8 + fVar109 * auVar157._8_4_;
          auVar142._12_4_ = fVar166 * fStack_12b4 + fVar111 * auVar157._12_4_;
          auVar142._16_4_ = fVar94 * fStack_12b0 + fVar220 * auVar157._16_4_;
          auVar142._20_4_ = fVar164 * fStack_12ac + fVar107 * auVar157._20_4_;
          auVar142._24_4_ = fVar165 * fStack_12a8 + fVar109 * auVar157._24_4_;
          auVar142._28_4_ = auVar157._28_4_ + auVar25._28_4_;
          local_1368 = pGVar8->data + uVar80 * 0xc + lVar72 + -4;
          auVar141 = vshufps_avx(auVar254,auVar254,0xa5);
          auVar157 = vshufps_avx(auVar150,auVar150,0x94);
          fVar89 = auVar141._28_4_;
          local_1320._0_4_ = auVar128._0_4_;
          local_1320._4_4_ = auVar128._4_4_;
          uStack_1318._0_4_ = auVar128._8_4_;
          uStack_1318._4_4_ = auVar128._12_4_;
          auStack_1310._0_4_ = auVar128._16_4_;
          auStack_1310._4_4_ = auVar128._20_4_;
          fStack_1308 = auVar128._24_4_;
          fVar88 = auVar129._28_4_;
          auVar172._0_4_ = fVar94 * (float)local_1320._0_4_ + fVar220 * auVar187._0_4_;
          auVar172._4_4_ = fVar164 * (float)local_1320._4_4_ + fVar107 * auVar187._4_4_;
          auVar172._8_4_ = fVar165 * (float)uStack_1318 + fVar109 * auVar187._8_4_;
          auVar172._12_4_ = fVar166 * uStack_1318._4_4_ + fVar111 * auVar187._12_4_;
          auVar172._16_4_ = fVar94 * (float)auStack_1310._0_4_ + fVar220 * auVar187._16_4_;
          auVar172._20_4_ = fVar164 * (float)auStack_1310._4_4_ + fVar107 * auVar187._20_4_;
          auVar172._24_4_ = fVar165 * fStack_1308 + fVar109 * auVar187._24_4_;
          auVar172._28_4_ = fVar88 + 0.0;
          auVar198._0_4_ = fVar94 * auVar129._0_4_ + fVar220 * auVar141._0_4_;
          auVar198._4_4_ = fVar164 * auVar129._4_4_ + fVar107 * auVar141._4_4_;
          auVar198._8_4_ = fVar165 * auVar129._8_4_ + fVar109 * auVar141._8_4_;
          auVar198._12_4_ = fVar166 * auVar129._12_4_ + fVar111 * auVar141._12_4_;
          auVar198._16_4_ = fVar94 * auVar129._16_4_ + fVar220 * auVar141._16_4_;
          auVar198._20_4_ = fVar164 * auVar129._20_4_ + fVar107 * auVar141._20_4_;
          auVar198._24_4_ = fVar165 * auVar129._24_4_ + fVar109 * auVar141._24_4_;
          auVar198._28_4_ = fVar88 + fVar89;
          local_13a0._0_4_ = auVar203._0_4_;
          local_13a0._4_4_ = auVar203._4_4_;
          auStack_1398._0_4_ = auVar203._8_4_;
          auStack_1398._4_4_ = auVar203._12_4_;
          fStack_1390 = auVar203._16_4_;
          fStack_138c = auVar203._20_4_;
          fStack_1388 = auVar203._24_4_;
          local_1420._0_4_ = auVar119._0_4_;
          local_1420._4_4_ = auVar119._4_4_;
          fStack_1418 = auVar119._8_4_;
          fStack_1414 = auVar119._12_4_;
          fStack_1410 = auVar119._16_4_;
          fStack_140c = auVar119._20_4_;
          fStack_1408 = auVar119._24_4_;
          auVar188._0_4_ = fVar94 * (float)local_1420._0_4_ + fVar220 * (float)local_13a0;
          auVar188._4_4_ = fVar164 * (float)local_1420._4_4_ + fVar107 * local_13a0._4_4_;
          auVar188._8_4_ = fVar165 * fStack_1418 + fVar109 * (float)auStack_1398._0_4_;
          auVar188._12_4_ = fVar166 * fStack_1414 + fVar111 * (float)auStack_1398._4_4_;
          auVar188._16_4_ = fVar94 * fStack_1410 + fVar220 * fStack_1390;
          auVar188._20_4_ = fVar164 * fStack_140c + fVar107 * fStack_138c;
          auVar188._24_4_ = fVar165 * fStack_1408 + fVar109 * fStack_1388;
          auVar188._28_4_ = auVar253._28_4_ + fVar89;
          local_1440._0_4_ = auVar149._0_4_;
          local_1440._4_4_ = auVar149._4_4_;
          fStack_1438 = auVar149._8_4_;
          fStack_1434 = auVar149._12_4_;
          fStack_1430 = auVar149._16_4_;
          fStack_142c = auVar149._20_4_;
          fStack_1428 = auVar149._24_4_;
          auVar91._0_4_ = fVar94 * (float)local_1440._0_4_ + fVar220 * auVar253._0_4_;
          auVar91._4_4_ = fVar164 * (float)local_1440._4_4_ + fVar107 * auVar253._4_4_;
          auVar91._8_4_ = fVar165 * fStack_1438 + fVar109 * auVar253._8_4_;
          auVar91._12_4_ = fVar166 * fStack_1434 + fVar111 * auVar253._12_4_;
          auVar91._16_4_ = fVar94 * fStack_1430 + fVar220 * auVar253._16_4_;
          auVar91._20_4_ = fVar164 * fStack_142c + fVar107 * auVar253._20_4_;
          auVar91._24_4_ = fVar165 * fStack_1428 + fVar109 * auVar253._24_4_;
          auVar91._28_4_ = fVar89 + fVar88;
          local_1460._0_4_ = auVar156._0_4_;
          local_1460._4_4_ = auVar156._4_4_;
          uStack_1458._0_4_ = auVar156._8_4_;
          uStack_1458._4_4_ = auVar156._12_4_;
          uStack_1450._0_4_ = auVar156._16_4_;
          uStack_1450._4_4_ = auVar156._20_4_;
          uStack_1448._0_4_ = auVar156._24_4_;
          auVar151._0_4_ = fVar94 * (float)local_1460._0_4_ + fVar220 * auVar157._0_4_;
          auVar151._4_4_ = fVar164 * (float)local_1460._4_4_ + fVar107 * auVar157._4_4_;
          auVar151._8_4_ = fVar165 * (float)uStack_1458 + fVar109 * auVar157._8_4_;
          auVar151._12_4_ = fVar166 * uStack_1458._4_4_ + fVar111 * auVar157._12_4_;
          auVar151._16_4_ = fVar94 * (float)uStack_1450 + fVar220 * auVar157._16_4_;
          auVar151._20_4_ = fVar164 * uStack_1450._4_4_ + fVar107 * auVar157._20_4_;
          auVar151._24_4_ = fVar165 * (float)uStack_1448 + fVar109 * auVar157._24_4_;
          auVar151._28_4_ = fVar89 + auVar157._28_4_;
          uVar5 = pGVar8->_geomID;
          uVar77 = pGVar8->_primID;
          local_11a0 = &local_1368;
          uVar87 = *(undefined4 *)(ray + k * 4);
          auVar204._4_4_ = uVar87;
          auVar204._0_4_ = uVar87;
          auVar204._8_4_ = uVar87;
          auVar204._12_4_ = uVar87;
          auVar204._16_4_ = uVar87;
          auVar204._20_4_ = uVar87;
          auVar204._24_4_ = uVar87;
          auVar204._28_4_ = uVar87;
          uVar87 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar218._4_4_ = uVar87;
          auVar218._0_4_ = uVar87;
          auVar218._8_4_ = uVar87;
          auVar218._12_4_ = uVar87;
          auVar218._16_4_ = uVar87;
          auVar218._20_4_ = uVar87;
          auVar218._24_4_ = uVar87;
          auVar218._28_4_ = uVar87;
          uVar87 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar222._4_4_ = uVar87;
          auVar222._0_4_ = uVar87;
          auVar222._8_4_ = uVar87;
          auVar222._12_4_ = uVar87;
          auVar222._16_4_ = uVar87;
          auVar222._20_4_ = uVar87;
          auVar222._24_4_ = uVar87;
          auVar222._28_4_ = uVar87;
          auVar149 = vsubps_avx(auVar90,auVar204);
          auVar129 = vsubps_avx(auVar233,auVar218);
          auVar141 = vsubps_avx(auVar130,auVar222);
          auVar119 = vsubps_avx(auVar142,auVar204);
          auVar128 = vsubps_avx(auVar172,auVar218);
          auVar156 = vsubps_avx(auVar198,auVar222);
          auVar157 = vsubps_avx(auVar188,auVar204);
          auVar203 = vsubps_avx(auVar91,auVar218);
          auVar187 = vsubps_avx(auVar151,auVar222);
          _local_12c0 = vsubps_avx(auVar157,auVar149);
          local_1300 = vsubps_avx(auVar203,auVar129);
          _local_12e0 = vsubps_avx(auVar187,auVar141);
          fVar164 = auVar129._0_4_;
          fVar89 = auVar203._0_4_ + fVar164;
          fVar220 = auVar129._4_4_;
          fVar88 = auVar203._4_4_ + fVar220;
          fVar111 = auVar129._8_4_;
          fVar94 = auVar203._8_4_ + fVar111;
          fVar116 = auVar129._12_4_;
          fVar95 = auVar203._12_4_ + fVar116;
          fVar14 = auVar129._16_4_;
          fVar96 = auVar203._16_4_ + fVar14;
          fVar17 = auVar129._20_4_;
          fVar97 = auVar203._20_4_ + fVar17;
          fVar20 = auVar129._24_4_;
          fVar98 = auVar203._24_4_ + fVar20;
          fVar165 = auVar141._0_4_;
          fVar167 = auVar187._0_4_ + fVar165;
          fVar107 = auVar141._4_4_;
          fVar177 = auVar187._4_4_ + fVar107;
          fVar113 = auVar141._8_4_;
          fVar179 = auVar187._8_4_ + fVar113;
          fVar12 = auVar141._12_4_;
          fVar180 = auVar187._12_4_ + fVar12;
          fVar15 = auVar141._16_4_;
          fVar181 = auVar187._16_4_ + fVar15;
          fVar18 = auVar141._20_4_;
          fVar182 = auVar187._20_4_ + fVar18;
          fVar21 = auVar141._24_4_;
          fVar183 = auVar187._24_4_ + fVar21;
          fVar168 = auVar141._28_4_;
          fVar184 = auVar187._28_4_ + fVar168;
          fVar106 = local_12e0._0_4_;
          fVar108 = local_12e0._4_4_;
          auVar25._4_4_ = fVar88 * fVar108;
          auVar25._0_4_ = fVar89 * fVar106;
          fVar110 = local_12e0._8_4_;
          auVar25._8_4_ = fVar94 * fVar110;
          fVar112 = local_12e0._12_4_;
          auVar25._12_4_ = fVar95 * fVar112;
          fVar114 = local_12e0._16_4_;
          auVar25._16_4_ = fVar96 * fVar114;
          fVar23 = local_12e0._20_4_;
          auVar25._20_4_ = fVar97 * fVar23;
          fVar24 = local_12e0._24_4_;
          auVar25._24_4_ = fVar98 * fVar24;
          auVar25._28_4_ = auVar188._28_4_;
          fVar230 = local_1300._0_4_;
          fVar234 = local_1300._4_4_;
          auVar26._4_4_ = fVar234 * fVar177;
          auVar26._0_4_ = fVar230 * fVar167;
          fVar237 = local_1300._8_4_;
          auVar26._8_4_ = fVar237 * fVar179;
          fVar240 = local_1300._12_4_;
          auVar26._12_4_ = fVar240 * fVar180;
          fVar243 = local_1300._16_4_;
          auVar26._16_4_ = fVar243 * fVar181;
          fVar246 = local_1300._20_4_;
          auVar26._20_4_ = fVar246 * fVar182;
          fVar249 = local_1300._24_4_;
          auVar26._24_4_ = fVar249 * fVar183;
          auVar26._28_4_ = auVar198._28_4_;
          auVar253 = vsubps_avx(auVar26,auVar25);
          fVar166 = auVar149._0_4_;
          fVar185 = auVar157._0_4_ + fVar166;
          fVar109 = auVar149._4_4_;
          fVar192 = auVar157._4_4_ + fVar109;
          fVar115 = auVar149._8_4_;
          fVar193 = auVar157._8_4_ + fVar115;
          fVar13 = auVar149._12_4_;
          fVar194 = auVar157._12_4_ + fVar13;
          fVar16 = auVar149._16_4_;
          fVar195 = auVar157._16_4_ + fVar16;
          fVar19 = auVar149._20_4_;
          fVar196 = auVar157._20_4_ + fVar19;
          fVar22 = auVar149._24_4_;
          fVar197 = auVar157._24_4_ + fVar22;
          fVar160 = auVar157._28_4_;
          fVar200 = local_12c0._0_4_;
          fVar205 = local_12c0._4_4_;
          auVar27._4_4_ = fVar205 * fVar177;
          auVar27._0_4_ = fVar200 * fVar167;
          fVar207 = local_12c0._8_4_;
          auVar27._8_4_ = fVar207 * fVar179;
          fVar209 = local_12c0._12_4_;
          auVar27._12_4_ = fVar209 * fVar180;
          fVar211 = local_12c0._16_4_;
          auVar27._16_4_ = fVar211 * fVar181;
          fVar213 = local_12c0._20_4_;
          auVar27._20_4_ = fVar213 * fVar182;
          fVar215 = local_12c0._24_4_;
          auVar27._24_4_ = fVar215 * fVar183;
          auVar27._28_4_ = fVar184;
          auVar28._4_4_ = fVar192 * fVar108;
          auVar28._0_4_ = fVar185 * fVar106;
          auVar28._8_4_ = fVar193 * fVar110;
          auVar28._12_4_ = fVar194 * fVar112;
          auVar28._16_4_ = fVar195 * fVar114;
          auVar28._20_4_ = fVar196 * fVar23;
          auVar28._24_4_ = fVar197 * fVar24;
          auVar28._28_4_ = auVar198._28_4_;
          auVar25 = vsubps_avx(auVar28,auVar27);
          auVar29._4_4_ = fVar192 * fVar234;
          auVar29._0_4_ = fVar185 * fVar230;
          auVar29._8_4_ = fVar193 * fVar237;
          auVar29._12_4_ = fVar194 * fVar240;
          auVar29._16_4_ = fVar195 * fVar243;
          auVar29._20_4_ = fVar196 * fVar246;
          auVar29._24_4_ = fVar197 * fVar249;
          auVar29._28_4_ = fVar184;
          auVar30._4_4_ = fVar205 * fVar88;
          auVar30._0_4_ = fVar200 * fVar89;
          auVar30._8_4_ = fVar207 * fVar94;
          auVar30._12_4_ = fVar209 * fVar95;
          auVar30._16_4_ = fVar211 * fVar96;
          auVar30._20_4_ = fVar213 * fVar97;
          auVar30._24_4_ = fVar215 * fVar98;
          auVar30._28_4_ = auVar203._28_4_ + auVar129._28_4_;
          auVar26 = vsubps_avx(auVar30,auVar29);
          fVar89 = *(float *)(ray + k * 4 + 0x50);
          fVar88 = *(float *)(ray + k * 4 + 0x60);
          fVar94 = *(float *)(ray + k * 4 + 0x40);
          local_1200._0_4_ =
               auVar253._0_4_ * fVar94 + fVar89 * auVar25._0_4_ + auVar26._0_4_ * fVar88;
          local_1200._4_4_ =
               auVar253._4_4_ * fVar94 + fVar89 * auVar25._4_4_ + auVar26._4_4_ * fVar88;
          local_1200._8_4_ =
               auVar253._8_4_ * fVar94 + fVar89 * auVar25._8_4_ + auVar26._8_4_ * fVar88;
          local_1200._12_4_ =
               auVar253._12_4_ * fVar94 + fVar89 * auVar25._12_4_ + auVar26._12_4_ * fVar88;
          auVar186._16_4_ =
               auVar253._16_4_ * fVar94 + fVar89 * auVar25._16_4_ + auVar26._16_4_ * fVar88;
          auVar186._0_16_ = local_1200;
          auVar186._20_4_ =
               auVar253._20_4_ * fVar94 + fVar89 * auVar25._20_4_ + auVar26._20_4_ * fVar88;
          auVar189._24_4_ =
               auVar253._24_4_ * fVar94 + fVar89 * auVar25._24_4_ + auVar26._24_4_ * fVar88;
          auVar189._0_24_ = auVar186;
          auVar189._28_4_ = auVar253._28_4_ + auVar25._28_4_ + auVar26._28_4_;
          local_fc0 = vsubps_avx(auVar129,auVar128);
          auVar141 = vsubps_avx(auVar141,auVar156);
          fVar96 = fVar164 + auVar128._0_4_;
          fVar97 = fVar220 + auVar128._4_4_;
          fVar98 = fVar111 + auVar128._8_4_;
          fVar167 = fVar116 + auVar128._12_4_;
          fVar177 = fVar14 + auVar128._16_4_;
          fVar179 = fVar17 + auVar128._20_4_;
          fVar180 = fVar20 + auVar128._24_4_;
          fVar95 = auVar128._28_4_;
          fVar181 = auVar156._0_4_ + fVar165;
          fVar182 = auVar156._4_4_ + fVar107;
          fVar183 = auVar156._8_4_ + fVar113;
          fVar184 = auVar156._12_4_ + fVar12;
          fVar185 = auVar156._16_4_ + fVar15;
          fVar192 = auVar156._20_4_ + fVar18;
          fVar193 = auVar156._24_4_ + fVar21;
          fVar252 = auVar141._0_4_;
          fVar255 = auVar141._4_4_;
          auVar31._4_4_ = fVar255 * fVar97;
          auVar31._0_4_ = fVar252 * fVar96;
          fVar256 = auVar141._8_4_;
          auVar31._8_4_ = fVar256 * fVar98;
          fVar257 = auVar141._12_4_;
          auVar31._12_4_ = fVar257 * fVar167;
          fVar258 = auVar141._16_4_;
          auVar31._16_4_ = fVar258 * fVar177;
          fVar259 = auVar141._20_4_;
          auVar31._20_4_ = fVar259 * fVar179;
          fVar260 = auVar141._24_4_;
          auVar31._24_4_ = fVar260 * fVar180;
          auVar31._28_4_ = auVar25._28_4_;
          fVar231 = local_fc0._0_4_;
          fVar235 = local_fc0._4_4_;
          auVar32._4_4_ = fVar235 * fVar182;
          auVar32._0_4_ = fVar231 * fVar181;
          fVar238 = local_fc0._8_4_;
          auVar32._8_4_ = fVar238 * fVar183;
          fVar241 = local_fc0._12_4_;
          auVar32._12_4_ = fVar241 * fVar184;
          fVar244 = local_fc0._16_4_;
          auVar32._16_4_ = fVar244 * fVar185;
          fVar247 = local_fc0._20_4_;
          auVar32._20_4_ = fVar247 * fVar192;
          fVar250 = local_fc0._24_4_;
          auVar32._24_4_ = fVar250 * fVar193;
          auVar32._28_4_ = fVar168;
          auVar141 = vsubps_avx(auVar32,auVar31);
          auVar253 = vsubps_avx(auVar149,auVar119);
          fVar221 = auVar253._0_4_;
          fVar224 = auVar253._4_4_;
          auVar33._4_4_ = fVar224 * fVar182;
          auVar33._0_4_ = fVar221 * fVar181;
          fVar225 = auVar253._8_4_;
          auVar33._8_4_ = fVar225 * fVar183;
          fVar226 = auVar253._12_4_;
          auVar33._12_4_ = fVar226 * fVar184;
          fVar227 = auVar253._16_4_;
          auVar33._16_4_ = fVar227 * fVar185;
          fVar228 = auVar253._20_4_;
          auVar33._20_4_ = fVar228 * fVar192;
          fVar229 = auVar253._24_4_;
          auVar33._24_4_ = fVar229 * fVar193;
          auVar33._28_4_ = auVar156._28_4_ + fVar168;
          fVar168 = auVar119._0_4_ + fVar166;
          fVar181 = auVar119._4_4_ + fVar109;
          fVar182 = auVar119._8_4_ + fVar115;
          fVar183 = auVar119._12_4_ + fVar13;
          fVar184 = auVar119._16_4_ + fVar16;
          fVar185 = auVar119._20_4_ + fVar19;
          fVar192 = auVar119._24_4_ + fVar22;
          fVar217 = auVar119._28_4_;
          auVar34._4_4_ = fVar181 * fVar255;
          auVar34._0_4_ = fVar168 * fVar252;
          auVar34._8_4_ = fVar182 * fVar256;
          auVar34._12_4_ = fVar183 * fVar257;
          auVar34._16_4_ = fVar184 * fVar258;
          auVar34._20_4_ = fVar185 * fVar259;
          auVar34._24_4_ = fVar192 * fVar260;
          auVar34._28_4_ = fVar217;
          auVar253 = vsubps_avx(auVar34,auVar33);
          auVar35._4_4_ = fVar181 * fVar235;
          auVar35._0_4_ = fVar168 * fVar231;
          auVar35._8_4_ = fVar182 * fVar238;
          auVar35._12_4_ = fVar183 * fVar241;
          auVar35._16_4_ = fVar184 * fVar244;
          auVar35._20_4_ = fVar185 * fVar247;
          auVar35._24_4_ = fVar192 * fVar250;
          auVar35._28_4_ = fVar217 + auVar149._28_4_;
          auVar36._4_4_ = fVar224 * fVar97;
          auVar36._0_4_ = fVar221 * fVar96;
          auVar36._8_4_ = fVar225 * fVar98;
          auVar36._12_4_ = fVar226 * fVar167;
          auVar36._16_4_ = fVar227 * fVar177;
          auVar36._20_4_ = fVar228 * fVar179;
          auVar36._24_4_ = fVar229 * fVar180;
          auVar36._28_4_ = auVar129._28_4_ + fVar95;
          auVar25 = vsubps_avx(auVar36,auVar35);
          fVar169 = fVar94 * auVar141._0_4_ + auVar25._0_4_ * fVar88 + fVar89 * auVar253._0_4_;
          fVar178 = fVar94 * auVar141._4_4_ + auVar25._4_4_ * fVar88 + fVar89 * auVar253._4_4_;
          auVar170._0_8_ = CONCAT44(fVar178,fVar169);
          auVar170._8_4_ =
               fVar94 * auVar141._8_4_ + auVar25._8_4_ * fVar88 + fVar89 * auVar253._8_4_;
          auVar170._12_4_ =
               fVar94 * auVar141._12_4_ + auVar25._12_4_ * fVar88 + fVar89 * auVar253._12_4_;
          auVar171._16_4_ =
               fVar94 * auVar141._16_4_ + auVar25._16_4_ * fVar88 + fVar89 * auVar253._16_4_;
          auVar171._0_16_ = auVar170;
          auVar171._20_4_ =
               fVar94 * auVar141._20_4_ + auVar25._20_4_ * fVar88 + fVar89 * auVar253._20_4_;
          auVar173._24_4_ =
               fVar94 * auVar141._24_4_ + auVar25._24_4_ * fVar88 + fVar89 * auVar253._24_4_;
          auVar173._0_24_ = auVar171;
          auVar173._28_4_ = auVar253._28_4_ + auVar25._28_4_ + auVar253._28_4_;
          local_fe0 = auVar173;
          auVar25 = local_fe0;
          auVar253 = vsubps_avx(auVar119,auVar157);
          fVar179 = auVar119._0_4_ + auVar157._0_4_;
          fVar180 = auVar119._4_4_ + auVar157._4_4_;
          fVar181 = auVar119._8_4_ + auVar157._8_4_;
          fVar182 = auVar119._12_4_ + auVar157._12_4_;
          fVar183 = auVar119._16_4_ + auVar157._16_4_;
          fVar184 = auVar119._20_4_ + auVar157._20_4_;
          fVar185 = auVar119._24_4_ + auVar157._24_4_;
          auVar141 = vsubps_avx(auVar128,auVar203);
          fVar192 = auVar128._0_4_ + auVar203._0_4_;
          fVar193 = auVar128._4_4_ + auVar203._4_4_;
          fVar194 = auVar128._8_4_ + auVar203._8_4_;
          fVar195 = auVar128._12_4_ + auVar203._12_4_;
          fVar196 = auVar128._16_4_ + auVar203._16_4_;
          fVar197 = auVar128._20_4_ + auVar203._20_4_;
          fVar122 = auVar128._24_4_ + auVar203._24_4_;
          fVar123 = fVar95 + auVar203._28_4_;
          auVar119 = vsubps_avx(auVar156,auVar187);
          fVar96 = auVar156._0_4_ + auVar187._0_4_;
          fVar97 = auVar156._4_4_ + auVar187._4_4_;
          fVar98 = auVar156._8_4_ + auVar187._8_4_;
          fVar167 = auVar156._12_4_ + auVar187._12_4_;
          fVar177 = auVar156._16_4_ + auVar187._16_4_;
          fVar135 = auVar156._20_4_ + auVar187._20_4_;
          fVar136 = auVar156._24_4_ + auVar187._24_4_;
          fVar232 = auVar119._0_4_;
          fVar236 = auVar119._4_4_;
          auVar37._4_4_ = fVar236 * fVar193;
          auVar37._0_4_ = fVar232 * fVar192;
          fVar239 = auVar119._8_4_;
          auVar37._8_4_ = fVar239 * fVar194;
          fVar242 = auVar119._12_4_;
          auVar37._12_4_ = fVar242 * fVar195;
          fVar245 = auVar119._16_4_;
          auVar37._16_4_ = fVar245 * fVar196;
          fVar248 = auVar119._20_4_;
          auVar37._20_4_ = fVar248 * fVar197;
          fVar251 = auVar119._24_4_;
          auVar37._24_4_ = fVar251 * fVar122;
          auVar37._28_4_ = fVar95;
          fVar201 = auVar141._0_4_;
          fVar206 = auVar141._4_4_;
          auVar38._4_4_ = fVar206 * fVar97;
          auVar38._0_4_ = fVar201 * fVar96;
          fVar208 = auVar141._8_4_;
          auVar38._8_4_ = fVar208 * fVar98;
          fVar210 = auVar141._12_4_;
          auVar38._12_4_ = fVar210 * fVar167;
          fVar212 = auVar141._16_4_;
          auVar38._16_4_ = fVar212 * fVar177;
          fVar214 = auVar141._20_4_;
          auVar38._20_4_ = fVar214 * fVar135;
          fVar216 = auVar141._24_4_;
          auVar38._24_4_ = fVar216 * fVar136;
          auVar38._28_4_ = fVar160;
          auVar141 = vsubps_avx(auVar38,auVar37);
          fVar168 = auVar253._0_4_;
          fVar95 = auVar253._4_4_;
          auVar39._4_4_ = fVar95 * fVar97;
          auVar39._0_4_ = fVar168 * fVar96;
          fVar96 = auVar253._8_4_;
          auVar39._8_4_ = fVar96 * fVar98;
          fVar97 = auVar253._12_4_;
          auVar39._12_4_ = fVar97 * fVar167;
          fVar98 = auVar253._16_4_;
          auVar39._16_4_ = fVar98 * fVar177;
          fVar167 = auVar253._20_4_;
          auVar39._20_4_ = fVar167 * fVar135;
          fVar177 = auVar253._24_4_;
          auVar39._24_4_ = fVar177 * fVar136;
          auVar39._28_4_ = auVar156._28_4_ + auVar187._28_4_;
          auVar40._4_4_ = fVar236 * fVar180;
          auVar40._0_4_ = fVar232 * fVar179;
          auVar40._8_4_ = fVar239 * fVar181;
          auVar40._12_4_ = fVar242 * fVar182;
          auVar40._16_4_ = fVar245 * fVar183;
          auVar40._20_4_ = fVar248 * fVar184;
          auVar40._24_4_ = fVar251 * fVar185;
          auVar40._28_4_ = fVar160;
          auVar119 = vsubps_avx(auVar40,auVar39);
          auVar41._4_4_ = fVar206 * fVar180;
          auVar41._0_4_ = fVar201 * fVar179;
          auVar41._8_4_ = fVar208 * fVar181;
          auVar41._12_4_ = fVar210 * fVar182;
          auVar41._16_4_ = fVar212 * fVar183;
          auVar41._20_4_ = fVar214 * fVar184;
          auVar41._24_4_ = fVar216 * fVar185;
          auVar41._28_4_ = fVar217 + fVar160;
          auVar42._4_4_ = fVar95 * fVar193;
          auVar42._0_4_ = fVar168 * fVar192;
          auVar42._8_4_ = fVar96 * fVar194;
          auVar42._12_4_ = fVar97 * fVar195;
          auVar42._16_4_ = fVar98 * fVar196;
          auVar42._20_4_ = fVar167 * fVar197;
          auVar42._24_4_ = fVar177 * fVar122;
          auVar42._28_4_ = fVar123;
          auVar128 = vsubps_avx(auVar42,auVar41);
          auVar102._0_4_ =
               fVar94 * auVar141._0_4_ + auVar128._0_4_ * fVar88 + fVar89 * auVar119._0_4_;
          auVar102._4_4_ =
               fVar94 * auVar141._4_4_ + auVar128._4_4_ * fVar88 + fVar89 * auVar119._4_4_;
          auVar102._8_4_ =
               fVar94 * auVar141._8_4_ + auVar128._8_4_ * fVar88 + fVar89 * auVar119._8_4_;
          auVar102._12_4_ =
               fVar94 * auVar141._12_4_ + auVar128._12_4_ * fVar88 + fVar89 * auVar119._12_4_;
          auVar102._16_4_ =
               fVar94 * auVar141._16_4_ + auVar128._16_4_ * fVar88 + fVar89 * auVar119._16_4_;
          auVar102._20_4_ =
               fVar94 * auVar141._20_4_ + auVar128._20_4_ * fVar88 + fVar89 * auVar119._20_4_;
          auVar102._24_4_ =
               fVar94 * auVar141._24_4_ + auVar128._24_4_ * fVar88 + fVar89 * auVar119._24_4_;
          auVar102._28_4_ = fVar123 + auVar128._28_4_ + fVar123;
          local_1000._0_4_ = auVar102._0_4_ + local_1200._0_4_ + fVar169;
          local_1000._4_4_ = auVar102._4_4_ + local_1200._4_4_ + fVar178;
          local_1000._8_4_ = auVar102._8_4_ + local_1200._8_4_ + auVar170._8_4_;
          local_1000._12_4_ = auVar102._12_4_ + local_1200._12_4_ + auVar170._12_4_;
          local_1000._16_4_ = auVar102._16_4_ + auVar186._16_4_ + auVar171._16_4_;
          local_1000._20_4_ = auVar102._20_4_ + auVar186._20_4_ + auVar171._20_4_;
          local_1000._24_4_ = auVar102._24_4_ + auVar189._24_4_ + auVar173._24_4_;
          local_1000._28_4_ = auVar102._28_4_ + auVar189._28_4_ + auVar173._28_4_;
          auVar120._8_4_ = 0x7fffffff;
          auVar120._0_8_ = 0x7fffffff7fffffff;
          auVar120._12_4_ = 0x7fffffff;
          auVar120._16_4_ = 0x7fffffff;
          auVar120._20_4_ = 0x7fffffff;
          auVar120._24_4_ = 0x7fffffff;
          auVar120._28_4_ = 0x7fffffff;
          auVar141 = vandps_avx(local_1000,auVar120);
          fVar179 = auVar141._0_4_ * 1.1920929e-07;
          fVar180 = auVar141._4_4_ * 1.1920929e-07;
          auVar43._4_4_ = fVar180;
          auVar43._0_4_ = fVar179;
          fVar181 = auVar141._8_4_ * 1.1920929e-07;
          auVar43._8_4_ = fVar181;
          fVar182 = auVar141._12_4_ * 1.1920929e-07;
          auVar43._12_4_ = fVar182;
          fVar183 = auVar141._16_4_ * 1.1920929e-07;
          auVar43._16_4_ = fVar183;
          fVar184 = auVar141._20_4_ * 1.1920929e-07;
          auVar43._20_4_ = fVar184;
          uVar10 = auVar141._28_4_;
          fVar185 = auVar141._24_4_ * 1.1920929e-07;
          auVar43._24_4_ = fVar185;
          auVar43._28_4_ = uVar10;
          auVar141 = vminps_avx(auVar189,auVar173);
          auVar141 = vminps_avx(auVar141,auVar102);
          auVar152._0_8_ = CONCAT44(fVar180,fVar179) ^ 0x8000000080000000;
          auVar152._8_4_ = -fVar181;
          auVar152._12_4_ = -fVar182;
          auVar152._16_4_ = -fVar183;
          auVar152._20_4_ = -fVar184;
          auVar152._24_4_ = -fVar185;
          auVar152._28_4_ = uVar10 ^ 0x80000000;
          auVar141 = vcmpps_avx(auVar141,auVar152,5);
          auVar128 = vmaxps_avx(auVar189,auVar173);
          auVar119 = vmaxps_avx(auVar128,auVar102);
          auVar119 = vcmpps_avx(auVar119,auVar43,2);
          auVar119 = vorps_avx(auVar141,auVar119);
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0x7f,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0xbf,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar119[0x1f] < '\0') {
            auVar44._4_4_ = fVar235 * fVar108;
            auVar44._0_4_ = fVar231 * fVar106;
            auVar44._8_4_ = fVar238 * fVar110;
            auVar44._12_4_ = fVar241 * fVar112;
            auVar44._16_4_ = fVar244 * fVar114;
            auVar44._20_4_ = fVar247 * fVar23;
            auVar44._24_4_ = fVar250 * fVar24;
            auVar44._28_4_ = uVar10;
            auVar45._4_4_ = fVar234 * fVar255;
            auVar45._0_4_ = fVar230 * fVar252;
            auVar45._8_4_ = fVar237 * fVar256;
            auVar45._12_4_ = fVar240 * fVar257;
            auVar45._16_4_ = fVar243 * fVar258;
            auVar45._20_4_ = fVar246 * fVar259;
            auVar45._24_4_ = fVar249 * fVar260;
            auVar45._28_4_ = auVar141._28_4_;
            auVar156 = vsubps_avx(auVar45,auVar44);
            auVar46._4_4_ = fVar206 * fVar255;
            auVar46._0_4_ = fVar201 * fVar252;
            auVar46._8_4_ = fVar208 * fVar256;
            auVar46._12_4_ = fVar210 * fVar257;
            auVar46._16_4_ = fVar212 * fVar258;
            auVar46._20_4_ = fVar214 * fVar259;
            auVar46._24_4_ = fVar216 * fVar260;
            auVar46._28_4_ = auVar128._28_4_;
            auVar47._4_4_ = fVar235 * fVar236;
            auVar47._0_4_ = fVar231 * fVar232;
            auVar47._8_4_ = fVar238 * fVar239;
            auVar47._12_4_ = fVar241 * fVar242;
            auVar47._16_4_ = fVar244 * fVar245;
            auVar47._20_4_ = fVar247 * fVar248;
            auVar47._24_4_ = fVar250 * fVar251;
            auVar47._28_4_ = fVar160;
            auVar157 = vsubps_avx(auVar47,auVar46);
            auVar174._8_4_ = 0x7fffffff;
            auVar174._0_8_ = 0x7fffffff7fffffff;
            auVar174._12_4_ = 0x7fffffff;
            auVar174._16_4_ = 0x7fffffff;
            auVar174._20_4_ = 0x7fffffff;
            auVar174._24_4_ = 0x7fffffff;
            auVar174._28_4_ = 0x7fffffff;
            auVar141 = vandps_avx(auVar174,auVar44);
            auVar128 = vandps_avx(auVar174,auVar46);
            auVar141 = vcmpps_avx(auVar141,auVar128,1);
            local_1100 = vblendvps_avx(auVar157,auVar156,auVar141);
            auVar48._4_4_ = fVar224 * fVar236;
            auVar48._0_4_ = fVar221 * fVar232;
            auVar48._8_4_ = fVar225 * fVar239;
            auVar48._12_4_ = fVar226 * fVar242;
            auVar48._16_4_ = fVar227 * fVar245;
            auVar48._20_4_ = fVar228 * fVar248;
            auVar48._24_4_ = fVar229 * fVar251;
            auVar48._28_4_ = auVar141._28_4_;
            auVar49._4_4_ = fVar224 * fVar108;
            auVar49._0_4_ = fVar221 * fVar106;
            auVar49._8_4_ = fVar225 * fVar110;
            auVar49._12_4_ = fVar226 * fVar112;
            auVar49._16_4_ = fVar227 * fVar114;
            auVar49._20_4_ = fVar228 * fVar23;
            auVar49._24_4_ = fVar229 * fVar24;
            auVar49._28_4_ = auVar156._28_4_;
            auVar50._4_4_ = fVar255 * fVar205;
            auVar50._0_4_ = fVar252 * fVar200;
            auVar50._8_4_ = fVar256 * fVar207;
            auVar50._12_4_ = fVar257 * fVar209;
            auVar50._16_4_ = fVar258 * fVar211;
            auVar50._20_4_ = fVar259 * fVar213;
            auVar50._24_4_ = fVar260 * fVar215;
            auVar50._28_4_ = uStack_12c4;
            auVar156 = vsubps_avx(auVar49,auVar50);
            auVar51._4_4_ = fVar255 * fVar95;
            auVar51._0_4_ = fVar252 * fVar168;
            auVar51._8_4_ = fVar256 * fVar96;
            auVar51._12_4_ = fVar257 * fVar97;
            auVar51._16_4_ = fVar258 * fVar98;
            auVar51._20_4_ = fVar259 * fVar167;
            auVar51._24_4_ = fVar260 * fVar177;
            auVar51._28_4_ = auVar128._28_4_;
            auVar157 = vsubps_avx(auVar51,auVar48);
            auVar141 = vandps_avx(auVar174,auVar50);
            auVar128 = vandps_avx(auVar174,auVar48);
            auVar128 = vcmpps_avx(auVar141,auVar128,1);
            local_10e0 = vblendvps_avx(auVar157,auVar156,auVar128);
            auVar52._4_4_ = fVar235 * fVar95;
            auVar52._0_4_ = fVar231 * fVar168;
            auVar52._8_4_ = fVar238 * fVar96;
            auVar52._12_4_ = fVar241 * fVar97;
            auVar52._16_4_ = fVar244 * fVar98;
            auVar52._20_4_ = fVar247 * fVar167;
            auVar52._24_4_ = fVar250 * fVar177;
            auVar52._28_4_ = auVar253._28_4_;
            auVar53._4_4_ = fVar235 * fVar205;
            auVar53._0_4_ = fVar231 * fVar200;
            auVar53._8_4_ = fVar238 * fVar207;
            auVar53._12_4_ = fVar241 * fVar209;
            auVar53._16_4_ = fVar244 * fVar211;
            auVar53._20_4_ = fVar247 * fVar213;
            auVar53._24_4_ = fVar250 * fVar215;
            auVar53._28_4_ = auVar128._28_4_;
            auVar54._4_4_ = fVar224 * fVar234;
            auVar54._0_4_ = fVar221 * fVar230;
            auVar54._8_4_ = fVar225 * fVar237;
            auVar54._12_4_ = fVar226 * fVar240;
            auVar54._16_4_ = fVar227 * fVar243;
            auVar54._20_4_ = fVar228 * fVar246;
            auVar54._24_4_ = fVar229 * fVar249;
            auVar54._28_4_ = auVar156._28_4_;
            auVar55._4_4_ = fVar224 * fVar206;
            auVar55._0_4_ = fVar221 * fVar201;
            auVar55._8_4_ = fVar225 * fVar208;
            auVar55._12_4_ = fVar226 * fVar210;
            auVar55._16_4_ = fVar227 * fVar212;
            auVar55._20_4_ = fVar228 * fVar214;
            auVar55._24_4_ = fVar229 * fVar216;
            auVar55._28_4_ = auVar141._28_4_;
            auVar156 = vsubps_avx(auVar53,auVar54);
            auVar203 = vsubps_avx(auVar55,auVar52);
            auVar141 = vandps_avx(auVar174,auVar54);
            auVar128 = vandps_avx(auVar174,auVar52);
            auVar128 = vcmpps_avx(auVar141,auVar128,1);
            local_10c0 = vblendvps_avx(auVar203,auVar156,auVar128);
            auVar99 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
            fVar168 = auVar141._28_4_;
            fVar95 = local_1100._0_4_ * fVar94 +
                     local_10c0._0_4_ * fVar88 + local_10e0._0_4_ * fVar89;
            fVar106 = local_1100._4_4_ * fVar94 +
                      local_10c0._4_4_ * fVar88 + local_10e0._4_4_ * fVar89;
            fVar108 = local_1100._8_4_ * fVar94 +
                      local_10c0._8_4_ * fVar88 + local_10e0._8_4_ * fVar89;
            fVar110 = local_1100._12_4_ * fVar94 +
                      local_10c0._12_4_ * fVar88 + local_10e0._12_4_ * fVar89;
            fVar112 = local_1100._16_4_ * fVar94 +
                      local_10c0._16_4_ * fVar88 + local_10e0._16_4_ * fVar89;
            fVar114 = local_1100._20_4_ * fVar94 +
                      local_10c0._20_4_ * fVar88 + local_10e0._20_4_ * fVar89;
            fVar89 = local_1100._24_4_ * fVar94 +
                     local_10c0._24_4_ * fVar88 + local_10e0._24_4_ * fVar89;
            fVar88 = fVar168 + auVar119._28_4_ + fVar168;
            auVar143._0_4_ = fVar95 + fVar95;
            auVar143._4_4_ = fVar106 + fVar106;
            auVar143._8_4_ = fVar108 + fVar108;
            auVar143._12_4_ = fVar110 + fVar110;
            auVar143._16_4_ = fVar112 + fVar112;
            auVar143._20_4_ = fVar114 + fVar114;
            auVar143._24_4_ = fVar89 + fVar89;
            auVar143._28_4_ = fVar88 + fVar88;
            fVar95 = local_1100._0_4_ * fVar166 +
                     local_10c0._0_4_ * fVar165 + local_10e0._0_4_ * fVar164;
            fVar107 = local_1100._4_4_ * fVar109 +
                      local_10c0._4_4_ * fVar107 + local_10e0._4_4_ * fVar220;
            fVar109 = local_1100._8_4_ * fVar115 +
                      local_10c0._8_4_ * fVar113 + local_10e0._8_4_ * fVar111;
            fVar111 = local_1100._12_4_ * fVar13 +
                      local_10c0._12_4_ * fVar12 + local_10e0._12_4_ * fVar116;
            fVar113 = local_1100._16_4_ * fVar16 +
                      local_10c0._16_4_ * fVar15 + local_10e0._16_4_ * fVar14;
            fVar115 = local_1100._20_4_ * fVar19 +
                      local_10c0._20_4_ * fVar18 + local_10e0._20_4_ * fVar17;
            fVar116 = local_1100._24_4_ * fVar22 +
                      local_10c0._24_4_ * fVar21 + local_10e0._24_4_ * fVar20;
            fVar168 = fVar168 + fVar88 + fVar168;
            auVar141 = vrcpps_avx(auVar143);
            fVar89 = auVar141._0_4_;
            fVar88 = auVar141._4_4_;
            auVar56._4_4_ = auVar143._4_4_ * fVar88;
            auVar56._0_4_ = auVar143._0_4_ * fVar89;
            fVar94 = auVar141._8_4_;
            auVar56._8_4_ = auVar143._8_4_ * fVar94;
            fVar164 = auVar141._12_4_;
            auVar56._12_4_ = auVar143._12_4_ * fVar164;
            fVar165 = auVar141._16_4_;
            auVar56._16_4_ = auVar143._16_4_ * fVar165;
            fVar166 = auVar141._20_4_;
            auVar56._20_4_ = auVar143._20_4_ * fVar166;
            fVar220 = auVar141._24_4_;
            auVar56._24_4_ = auVar143._24_4_ * fVar220;
            auVar56._28_4_ = auVar157._28_4_;
            auVar158._8_4_ = 0x3f800000;
            auVar158._0_8_ = &DAT_3f8000003f800000;
            auVar158._12_4_ = 0x3f800000;
            auVar158._16_4_ = 0x3f800000;
            auVar158._20_4_ = 0x3f800000;
            auVar158._24_4_ = 0x3f800000;
            auVar158._28_4_ = 0x3f800000;
            auVar141 = vsubps_avx(auVar158,auVar56);
            auVar57._4_4_ = (fVar107 + fVar107) * (fVar88 + fVar88 * auVar141._4_4_);
            auVar57._0_4_ = (fVar95 + fVar95) * (fVar89 + fVar89 * auVar141._0_4_);
            auVar57._8_4_ = (fVar109 + fVar109) * (fVar94 + fVar94 * auVar141._8_4_);
            auVar57._12_4_ = (fVar111 + fVar111) * (fVar164 + fVar164 * auVar141._12_4_);
            auVar57._16_4_ = (fVar113 + fVar113) * (fVar165 + fVar165 * auVar141._16_4_);
            auVar57._20_4_ = (fVar115 + fVar115) * (fVar166 + fVar166 * auVar141._20_4_);
            auVar57._24_4_ = (fVar116 + fVar116) * (fVar220 + fVar220 * auVar141._24_4_);
            auVar57._28_4_ = fVar168 + fVar168;
            uVar87 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar131._4_4_ = uVar87;
            auVar131._0_4_ = uVar87;
            auVar131._8_4_ = uVar87;
            auVar131._12_4_ = uVar87;
            auVar131._16_4_ = uVar87;
            auVar131._20_4_ = uVar87;
            auVar131._24_4_ = uVar87;
            auVar131._28_4_ = uVar87;
            auVar141 = vcmpps_avx(auVar131,auVar57,2);
            uVar87 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar153._4_4_ = uVar87;
            auVar153._0_4_ = uVar87;
            auVar153._8_4_ = uVar87;
            auVar153._12_4_ = uVar87;
            auVar153._16_4_ = uVar87;
            auVar153._20_4_ = uVar87;
            auVar153._24_4_ = uVar87;
            auVar153._28_4_ = uVar87;
            auVar119 = vcmpps_avx(auVar57,auVar153,2);
            auVar141 = vandps_avx(auVar119,auVar141);
            auVar117 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
            auVar99 = vpand_avx(auVar117,auVar99);
            auVar117 = vpmovsxwd_avx(auVar99);
            auVar161 = vpshufd_avx(auVar99,0xee);
            auVar161 = vpmovsxwd_avx(auVar161);
            auVar132._16_16_ = auVar161;
            auVar132._0_16_ = auVar117;
            if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar132 >> 0x7f,0) != '\0') ||
                  (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar161 >> 0x3f,0) != '\0') ||
                (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar161[0xf] < '\0') {
              auVar141 = vcmpps_avx(auVar143,_DAT_02020f00,4);
              auVar117 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
              auVar99 = vpand_avx(auVar99,auVar117);
              auVar117 = vpmovsxwd_avx(auVar99);
              auVar99 = vpunpckhwd_avx(auVar99,auVar99);
              local_1180._16_16_ = auVar99;
              local_1180._0_16_ = auVar117;
              if ((((((((local_1180 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1180 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1180 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1180 >> 0x7f,0) != '\0') ||
                    (local_1180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar99 >> 0x3f,0) != '\0') ||
                  (local_1180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar99[0xf] < '\0') {
                uStack_1450 = auVar186._16_8_;
                uStack_1448 = auVar189._24_8_;
                uStack_11f0 = uStack_1450;
                uStack_11e8 = uStack_1448;
                local_fe0._8_8_ = auVar170._8_8_;
                local_fe0._16_8_ = auVar171._16_8_;
                local_fe0._24_8_ = auVar173._24_8_;
                local_11e0 = auVar170._0_8_;
                uStack_11d8 = local_fe0._8_8_;
                uStack_11d0 = local_fe0._16_8_;
                uStack_11c8 = local_fe0._24_8_;
                local_11c0 = local_1000;
                local_11a0 = &local_1368;
                local_1120 = auVar57;
                pGVar85 = (context->scene->geometries).items[uVar5].ptr;
                if ((pGVar85->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar121._8_4_ = 0x7fffffff;
                  auVar121._0_8_ = 0x7fffffff7fffffff;
                  auVar121._12_4_ = 0x7fffffff;
                  auVar121._16_4_ = 0x7fffffff;
                  auVar121._20_4_ = 0x7fffffff;
                  auVar121._24_4_ = 0x7fffffff;
                  auVar121._28_4_ = 0x7fffffff;
                  auVar141 = vandps_avx(local_1000,auVar121);
                  auVar133._8_4_ = 0x219392ef;
                  auVar133._0_8_ = 0x219392ef219392ef;
                  auVar133._12_4_ = 0x219392ef;
                  auVar133._16_4_ = 0x219392ef;
                  auVar133._20_4_ = 0x219392ef;
                  auVar133._24_4_ = 0x219392ef;
                  auVar133._28_4_ = 0x219392ef;
                  auVar141 = vcmpps_avx(auVar141,auVar133,5);
                  auVar119 = vrcpps_avx(local_1000);
                  fVar89 = auVar119._0_4_;
                  fVar88 = auVar119._4_4_;
                  auVar58._4_4_ = local_1000._4_4_ * fVar88;
                  auVar58._0_4_ = local_1000._0_4_ * fVar89;
                  fVar94 = auVar119._8_4_;
                  auVar58._8_4_ = local_1000._8_4_ * fVar94;
                  fVar164 = auVar119._12_4_;
                  auVar58._12_4_ = local_1000._12_4_ * fVar164;
                  fVar165 = auVar119._16_4_;
                  auVar58._16_4_ = local_1000._16_4_ * fVar165;
                  fVar166 = auVar119._20_4_;
                  auVar58._20_4_ = local_1000._20_4_ * fVar166;
                  fVar220 = auVar119._24_4_;
                  auVar58._24_4_ = local_1000._24_4_ * fVar220;
                  auVar58._28_4_ = local_1000._28_4_;
                  auVar144._8_4_ = 0x3f800000;
                  auVar144._0_8_ = &DAT_3f8000003f800000;
                  auVar144._12_4_ = 0x3f800000;
                  auVar144._16_4_ = 0x3f800000;
                  auVar144._20_4_ = 0x3f800000;
                  auVar144._24_4_ = 0x3f800000;
                  auVar144._28_4_ = 0x3f800000;
                  auVar128 = vsubps_avx(auVar144,auVar58);
                  auVar103._0_4_ = fVar89 + fVar89 * auVar128._0_4_;
                  auVar103._4_4_ = fVar88 + fVar88 * auVar128._4_4_;
                  auVar103._8_4_ = fVar94 + fVar94 * auVar128._8_4_;
                  auVar103._12_4_ = fVar164 + fVar164 * auVar128._12_4_;
                  auVar103._16_4_ = fVar165 + fVar165 * auVar128._16_4_;
                  auVar103._20_4_ = fVar166 + fVar166 * auVar128._20_4_;
                  auVar103._24_4_ = fVar220 + fVar220 * auVar128._24_4_;
                  auVar103._28_4_ = auVar119._28_4_ + auVar128._28_4_;
                  auVar141 = vandps_avx(auVar141,auVar103);
                  auVar59._4_4_ = auVar141._4_4_ * local_1200._4_4_;
                  auVar59._0_4_ = auVar141._0_4_ * local_1200._0_4_;
                  auVar59._8_4_ = auVar141._8_4_ * local_1200._8_4_;
                  auVar59._12_4_ = auVar141._12_4_ * local_1200._12_4_;
                  auVar59._16_4_ = auVar141._16_4_ * auVar186._16_4_;
                  auVar59._20_4_ = auVar141._20_4_ * auVar186._20_4_;
                  auVar59._24_4_ = auVar141._24_4_ * auVar189._24_4_;
                  auVar59._28_4_ = auVar103._28_4_;
                  auVar119 = vminps_avx(auVar59,auVar144);
                  auVar60._4_4_ = auVar141._4_4_ * fVar178;
                  auVar60._0_4_ = auVar141._0_4_ * fVar169;
                  auVar60._8_4_ = auVar141._8_4_ * auVar170._8_4_;
                  auVar60._12_4_ = auVar141._12_4_ * auVar170._12_4_;
                  auVar60._16_4_ = auVar141._16_4_ * auVar171._16_4_;
                  auVar60._20_4_ = auVar141._20_4_ * auVar171._20_4_;
                  auVar60._24_4_ = auVar141._24_4_ * auVar173._24_4_;
                  auVar60._28_4_ = auVar141._28_4_;
                  auVar141 = vminps_avx(auVar60,auVar144);
                  auVar99 = *(undefined1 (*) [16])(local_1368 + local_1360 * 4);
                  auVar117 = auVar99;
                  if (2 < local_1358) {
                    auVar117 = *(undefined1 (*) [16])(local_1368 + local_1360 * 8);
                  }
                  auVar161 = *(undefined1 (*) [16])local_1368;
                  if (local_1360 == 2) {
                    auVar161 = vpshufd_avx(auVar161,0x54);
                    auVar99 = vpshufd_avx(auVar99,0x54);
                    auVar117 = vpshufd_avx(auVar117,0x54);
                  }
                  auVar159._16_16_ = auVar99;
                  auVar159._0_16_ = auVar161;
                  auVar162._16_16_ = auVar117;
                  auVar162._0_16_ = auVar99;
                  auVar128 = vunpcklps_avx(auVar159,auVar162);
                  auVar161 = vpshufd_avx(auVar161,0xa5);
                  auVar124 = vpshufd_avx(auVar99,0xa5);
                  auVar175._16_16_ = auVar124;
                  auVar175._0_16_ = auVar161;
                  auVar99 = vpshufd_avx(auVar99,0x94);
                  auVar117 = vpshufd_avx(auVar117,0x94);
                  auVar190._16_16_ = auVar117;
                  auVar190._0_16_ = auVar99;
                  auVar199._0_16_ = vpsrld_avx(auVar128._0_16_,0x10);
                  auVar202 = vpsrld_avx(auVar128._16_16_,0x10);
                  auVar219._8_4_ = 0xffff;
                  auVar219._0_8_ = 0xffff0000ffff;
                  auVar219._12_4_ = 0xffff;
                  auVar219._16_4_ = 0xffff;
                  auVar219._20_4_ = 0xffff;
                  auVar219._24_4_ = 0xffff;
                  auVar219._28_4_ = 0xffff;
                  auVar128 = vandps_avx(auVar219,auVar128);
                  auVar156 = vcvtdq2ps_avx(auVar128);
                  auVar199._16_16_ = auVar202;
                  auVar157 = vcvtdq2ps_avx(auVar199);
                  auVar154._0_16_ = vpsrld_avx(auVar161,0x10);
                  auVar161 = vpsrld_avx(auVar124,0x10);
                  auVar128 = vandps_avx(auVar175,auVar219);
                  auVar203 = vcvtdq2ps_avx(auVar128);
                  auVar154._16_16_ = auVar161;
                  auVar187 = vcvtdq2ps_avx(auVar154);
                  auVar134._0_16_ = vpsrld_avx(auVar99,0x10);
                  auVar99 = vpsrld_avx(auVar117,0x10);
                  auVar128 = vandps_avx(auVar190,auVar219);
                  auVar128 = vcvtdq2ps_avx(auVar128);
                  auVar134._16_16_ = auVar99;
                  auVar253 = vcvtdq2ps_avx(auVar134);
                  auVar148._8_4_ = 0x3f800000;
                  auVar148._0_8_ = &DAT_3f8000003f800000;
                  auVar148._12_4_ = 0x3f800000;
                  auVar155._16_4_ = 0x3f800000;
                  auVar155._0_16_ = auVar148;
                  auVar155._20_4_ = 0x3f800000;
                  auVar155._24_4_ = 0x3f800000;
                  auVar155._28_4_ = 0x3f800000;
                  auVar26 = vsubps_avx(auVar155,auVar119);
                  auVar26 = vsubps_avx(auVar26,auVar141);
                  local_1160[1] =
                       auVar141._4_4_ * auVar128._4_4_ * 0.00012207031 +
                       auVar203._4_4_ * 0.00012207031 * auVar119._4_4_ +
                       auVar26._4_4_ * auVar156._4_4_ * 0.00012207031;
                  local_1160[0] =
                       auVar141._0_4_ * auVar128._0_4_ * 0.00012207031 +
                       auVar203._0_4_ * 0.00012207031 * auVar119._0_4_ +
                       auVar26._0_4_ * auVar156._0_4_ * 0.00012207031;
                  local_1160[2] =
                       auVar141._8_4_ * auVar128._8_4_ * 0.00012207031 +
                       auVar203._8_4_ * 0.00012207031 * auVar119._8_4_ +
                       auVar26._8_4_ * auVar156._8_4_ * 0.00012207031;
                  local_1160[3] =
                       auVar141._12_4_ * auVar128._12_4_ * 0.00012207031 +
                       auVar203._12_4_ * 0.00012207031 * auVar119._12_4_ +
                       auVar26._12_4_ * auVar156._12_4_ * 0.00012207031;
                  fStack_1150 = auVar141._16_4_ * auVar128._16_4_ * 0.00012207031 +
                                auVar203._16_4_ * 0.00012207031 * auVar119._16_4_ +
                                auVar26._16_4_ * auVar156._16_4_ * 0.00012207031;
                  fStack_114c = auVar141._20_4_ * auVar128._20_4_ * 0.00012207031 +
                                auVar203._20_4_ * 0.00012207031 * auVar119._20_4_ +
                                auVar26._20_4_ * auVar156._20_4_ * 0.00012207031;
                  fStack_1148 = auVar141._24_4_ * auVar128._24_4_ * 0.00012207031 +
                                auVar203._24_4_ * 0.00012207031 * auVar119._24_4_ +
                                auVar26._24_4_ * auVar156._24_4_ * 0.00012207031;
                  fStack_1144 = auVar128._28_4_ + 0.0 + auVar141._28_4_;
                  local_1140[1] =
                       auVar141._4_4_ * auVar253._4_4_ * 0.00012207031 +
                       auVar119._4_4_ * auVar187._4_4_ * 0.00012207031 +
                       auVar157._4_4_ * 0.00012207031 * auVar26._4_4_;
                  local_1140[0] =
                       auVar141._0_4_ * auVar253._0_4_ * 0.00012207031 +
                       auVar119._0_4_ * auVar187._0_4_ * 0.00012207031 +
                       auVar157._0_4_ * 0.00012207031 * auVar26._0_4_;
                  local_1140[2] =
                       auVar141._8_4_ * auVar253._8_4_ * 0.00012207031 +
                       auVar119._8_4_ * auVar187._8_4_ * 0.00012207031 +
                       auVar157._8_4_ * 0.00012207031 * auVar26._8_4_;
                  local_1140[3] =
                       auVar141._12_4_ * auVar253._12_4_ * 0.00012207031 +
                       auVar119._12_4_ * auVar187._12_4_ * 0.00012207031 +
                       auVar157._12_4_ * 0.00012207031 * auVar26._12_4_;
                  fStack_1130 = auVar141._16_4_ * auVar253._16_4_ * 0.00012207031 +
                                auVar119._16_4_ * auVar187._16_4_ * 0.00012207031 +
                                auVar157._16_4_ * 0.00012207031 * auVar26._16_4_;
                  fStack_112c = auVar141._20_4_ * auVar253._20_4_ * 0.00012207031 +
                                auVar119._20_4_ * auVar187._20_4_ * 0.00012207031 +
                                auVar157._20_4_ * 0.00012207031 * auVar26._20_4_;
                  fStack_1128 = auVar141._24_4_ * auVar253._24_4_ * 0.00012207031 +
                                auVar119._24_4_ * auVar187._24_4_ * 0.00012207031 +
                                auVar157._24_4_ * 0.00012207031 * auVar26._24_4_;
                  fStack_1124 = auVar253._28_4_ + auVar187._28_4_ + auVar26._28_4_;
                  auVar104._8_4_ = 0x7f800000;
                  auVar104._0_8_ = 0x7f8000007f800000;
                  auVar104._12_4_ = 0x7f800000;
                  auVar104._16_4_ = 0x7f800000;
                  auVar104._20_4_ = 0x7f800000;
                  auVar104._24_4_ = 0x7f800000;
                  auVar104._28_4_ = 0x7f800000;
                  auVar141 = vblendvps_avx(auVar104,auVar57,local_1180);
                  auVar119 = vshufps_avx(auVar141,auVar141,0xb1);
                  auVar119 = vminps_avx(auVar141,auVar119);
                  auVar128 = vshufpd_avx(auVar119,auVar119,5);
                  auVar119 = vminps_avx(auVar119,auVar128);
                  auVar128 = vperm2f128_avx(auVar119,auVar119,1);
                  auVar119 = vminps_avx(auVar119,auVar128);
                  auVar119 = vcmpps_avx(auVar141,auVar119,0);
                  auVar128 = local_1180 & auVar119;
                  auVar141 = local_1180;
                  if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar128 >> 0x7f,0) != '\0') ||
                        (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar128 >> 0xbf,0) != '\0') ||
                      (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar128[0x1f] < '\0') {
                    auVar141 = vandps_avx(auVar119,local_1180);
                  }
                  auVar99 = vpcmpeqd_avx(auVar148,auVar148);
                  auVar93 = ZEXT1664(auVar99);
                  uVar76 = vmovmskps_avx(auVar141);
                  uVar10 = 0;
                  if (uVar76 != 0) {
                    for (; (uVar76 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                    }
                  }
                  uVar80 = (ulong)uVar10;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar85->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar89 = local_1160[uVar80];
                    fVar88 = local_1140[uVar80];
                    uVar6 = *(undefined4 *)(local_1100 + uVar80 * 4);
                    uVar87 = *(undefined4 *)(local_10e0 + uVar80 * 4);
                    uVar4 = *(undefined4 *)(local_10c0 + uVar80 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1120 + uVar80 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar6;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar87;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar4;
                    *(float *)(ray + k * 4 + 0xf0) = fVar89;
                    *(float *)(ray + k * 4 + 0x100) = fVar88;
                    *(uint *)(ray + k * 4 + 0x110) = uVar77;
                    *(uint *)(ray + k * 4 + 0x120) = uVar5;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    auVar99 = vpshufd_avx(ZEXT416(uVar5),0);
                    auVar117 = vpshufd_avx(ZEXT416(uVar77),0);
                    _auStack_1310 = auVar149._16_16_;
                    _local_1320 = *local_13b0;
                    _auStack_1398 = auVar129._8_24_;
                    local_13a0 = pGVar85;
                    local_12a0 = local_1180;
                    local_fe0 = auVar25;
                    do {
                      uVar87 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_1060 = local_1160[uVar80];
                      local_1050 = local_1140[uVar80];
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1120 + uVar80 * 4)
                      ;
                      local_1350.context = context->user;
                      uVar4 = *(undefined4 *)(local_1100 + uVar80 * 4);
                      uVar6 = *(undefined4 *)(local_10e0 + uVar80 * 4);
                      local_1080._4_4_ = uVar6;
                      local_1080._0_4_ = uVar6;
                      local_1080._8_4_ = uVar6;
                      local_1080._12_4_ = uVar6;
                      uVar6 = *(undefined4 *)(local_10c0 + uVar80 * 4);
                      local_1070._4_4_ = uVar6;
                      local_1070._0_4_ = uVar6;
                      local_1070._8_4_ = uVar6;
                      local_1070._12_4_ = uVar6;
                      local_1090[0] = (RTCHitN)(char)uVar4;
                      local_1090[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_1090[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_1090[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      local_1090[4] = (RTCHitN)(char)uVar4;
                      local_1090[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_1090[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_1090[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      local_1090[8] = (RTCHitN)(char)uVar4;
                      local_1090[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_1090[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_1090[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      local_1090[0xc] = (RTCHitN)(char)uVar4;
                      local_1090[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_1090[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_1090[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      fStack_105c = local_1060;
                      fStack_1058 = local_1060;
                      fStack_1054 = local_1060;
                      fStack_104c = local_1050;
                      fStack_1048 = local_1050;
                      fStack_1044 = local_1050;
                      local_1460 = auVar117._0_8_;
                      uStack_1458 = auVar117._8_8_;
                      local_1040 = local_1460;
                      uStack_1038 = uStack_1458;
                      local_1030 = auVar99;
                      vcmpps_avx(ZEXT1632(auVar99),ZEXT1632(auVar99),0xf);
                      uStack_101c = (local_1350.context)->instID[0];
                      local_1020 = uStack_101c;
                      uStack_1018 = uStack_101c;
                      uStack_1014 = uStack_101c;
                      uStack_1010 = (local_1350.context)->instPrimID[0];
                      uStack_100c = uStack_1010;
                      uStack_1008 = uStack_1010;
                      uStack_1004 = uStack_1010;
                      local_13c0 = local_1320;
                      uStack_13b8 = uStack_1318;
                      local_1350.valid = (int *)&local_13c0;
                      local_1350.geometryUserPtr = pGVar85->userPtr;
                      local_1350.hit = local_1090;
                      local_1350.N = 4;
                      local_1350.ray = (RTCRayN *)ray;
                      if (pGVar85->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar161 = auVar93._0_16_;
                        (*pGVar85->intersectionFilterN)(&local_1350);
                        auVar161 = vpcmpeqd_avx(auVar161,auVar161);
                        auVar93 = ZEXT1664(auVar161);
                        pGVar85 = local_13a0;
                      }
                      auVar69._8_8_ = uStack_13b8;
                      auVar69._0_8_ = local_13c0;
                      auVar161 = auVar93._0_16_;
                      if (auVar69 == (undefined1  [16])0x0) {
                        auVar124 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar124 = auVar124 ^ auVar161;
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar85->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var9)(&local_1350);
                          auVar161 = vpcmpeqd_avx(auVar161,auVar161);
                          auVar93 = ZEXT1664(auVar161);
                          pGVar85 = local_13a0;
                        }
                        auVar70._8_8_ = uStack_13b8;
                        auVar70._0_8_ = local_13c0;
                        auVar161 = vpcmpeqd_avx(auVar70,_DAT_01feba10);
                        auVar124 = auVar161 ^ auVar93._0_16_;
                        if (auVar70 != (undefined1  [16])0x0) {
                          auVar161 = auVar161 ^ auVar93._0_16_;
                          auVar202 = vmaskmovps_avx(auVar161,*(undefined1 (*) [16])local_1350.hit);
                          *(undefined1 (*) [16])(local_1350.ray + 0xc0) = auVar202;
                          auVar202 = vmaskmovps_avx(auVar161,*(undefined1 (*) [16])
                                                              (local_1350.hit + 0x10));
                          *(undefined1 (*) [16])(local_1350.ray + 0xd0) = auVar202;
                          auVar202 = vmaskmovps_avx(auVar161,*(undefined1 (*) [16])
                                                              (local_1350.hit + 0x20));
                          *(undefined1 (*) [16])(local_1350.ray + 0xe0) = auVar202;
                          auVar202 = vmaskmovps_avx(auVar161,*(undefined1 (*) [16])
                                                              (local_1350.hit + 0x30));
                          *(undefined1 (*) [16])(local_1350.ray + 0xf0) = auVar202;
                          auVar202 = vmaskmovps_avx(auVar161,*(undefined1 (*) [16])
                                                              (local_1350.hit + 0x40));
                          *(undefined1 (*) [16])(local_1350.ray + 0x100) = auVar202;
                          auVar202 = vmaskmovps_avx(auVar161,*(undefined1 (*) [16])
                                                              (local_1350.hit + 0x50));
                          *(undefined1 (*) [16])(local_1350.ray + 0x110) = auVar202;
                          auVar202 = vmaskmovps_avx(auVar161,*(undefined1 (*) [16])
                                                              (local_1350.hit + 0x60));
                          *(undefined1 (*) [16])(local_1350.ray + 0x120) = auVar202;
                          auVar202 = vmaskmovps_avx(auVar161,*(undefined1 (*) [16])
                                                              (local_1350.hit + 0x70));
                          *(undefined1 (*) [16])(local_1350.ray + 0x130) = auVar202;
                          auVar161 = vmaskmovps_avx(auVar161,*(undefined1 (*) [16])
                                                              (local_1350.hit + 0x80));
                          *(undefined1 (*) [16])(local_1350.ray + 0x140) = auVar161;
                        }
                      }
                      auVar101._8_8_ = 0x100000001;
                      auVar101._0_8_ = 0x100000001;
                      if ((auVar101 & auVar124) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar87;
                      }
                      *(undefined4 *)(local_12a0 + uVar80 * 4) = 0;
                      uVar87 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar92._4_4_ = uVar87;
                      auVar92._0_4_ = uVar87;
                      auVar92._8_4_ = uVar87;
                      auVar92._12_4_ = uVar87;
                      auVar92._16_4_ = uVar87;
                      auVar92._20_4_ = uVar87;
                      auVar92._24_4_ = uVar87;
                      auVar92._28_4_ = uVar87;
                      auVar119 = vcmpps_avx(auVar57,auVar92,2);
                      auVar141 = vandps_avx(auVar119,local_12a0);
                      local_12a0 = local_12a0 & auVar119;
                      bVar67 = (local_12a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar68 = (local_12a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar66 = (local_12a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar65 = SUB321(local_12a0 >> 0x7f,0) != '\0';
                      bVar64 = (local_12a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar63 = SUB321(local_12a0 >> 0xbf,0) != '\0';
                      bVar62 = (local_12a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar61 = local_12a0[0x1f] < '\0';
                      if (((((((bVar67 || bVar68) || bVar66) || bVar65) || bVar64) || bVar63) ||
                          bVar62) || bVar61) {
                        auVar105._8_4_ = 0x7f800000;
                        auVar105._0_8_ = 0x7f8000007f800000;
                        auVar105._12_4_ = 0x7f800000;
                        auVar105._16_4_ = 0x7f800000;
                        auVar105._20_4_ = 0x7f800000;
                        auVar105._24_4_ = 0x7f800000;
                        auVar105._28_4_ = 0x7f800000;
                        auVar119 = vblendvps_avx(auVar105,auVar57,auVar141);
                        auVar128 = vshufps_avx(auVar119,auVar119,0xb1);
                        auVar128 = vminps_avx(auVar119,auVar128);
                        auVar149 = vshufpd_avx(auVar128,auVar128,5);
                        auVar128 = vminps_avx(auVar128,auVar149);
                        auVar149 = vperm2f128_avx(auVar128,auVar128,1);
                        auVar128 = vminps_avx(auVar128,auVar149);
                        auVar128 = vcmpps_avx(auVar119,auVar128,0);
                        auVar149 = auVar141 & auVar128;
                        auVar119 = auVar141;
                        if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar149 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar149 >> 0x7f,0) != '\0')
                              || (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar149 >> 0xbf,0) != '\0') ||
                            (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar149[0x1f] < '\0') {
                          auVar119 = vandps_avx(auVar128,auVar141);
                        }
                        uVar77 = vmovmskps_avx(auVar119);
                        uVar5 = 0;
                        if (uVar77 != 0) {
                          for (; (uVar77 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                          }
                        }
                        uVar80 = (ulong)uVar5;
                      }
                      local_12a0 = auVar141;
                    } while (((((((bVar67 || bVar68) || bVar66) || bVar65) || bVar64) || bVar63) ||
                             bVar62) || bVar61);
                  }
                }
              }
            }
          }
          sVar75 = 0;
          auVar163 = ZEXT1664(local_1210);
          auVar176 = ZEXT1664(local_1220);
          auVar191 = ZEXT1664(local_1230);
          auVar223 = ZEXT1664(local_1270);
          fVar89 = local_1240;
          fVar164 = fStack_123c;
          fVar165 = fStack_1238;
          fVar166 = fStack_1234;
          fVar88 = local_1250;
          fVar220 = fStack_124c;
          fVar107 = fStack_1248;
          fVar109 = fStack_1244;
          fVar94 = local_1260;
          fVar111 = fStack_125c;
          fVar113 = fStack_1258;
          fVar115 = fStack_1254;
        }
        else {
          sVar75 = ((*(GridSOA **)(uVar80 & 0xfffffffffffffff0))->troot).ptr;
          (pre->super_Precalculations).grid = *(GridSOA **)(uVar80 & 0xfffffffffffffff0);
        }
        uVar87 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar93 = ZEXT1664(CONCAT412(uVar87,CONCAT48(uVar87,CONCAT44(uVar87,uVar87))));
        if (sVar75 != 0) {
          *(size_t *)*pauVar82 = sVar75;
          *(undefined4 *)(*pauVar82 + 8) = 0;
          pauVar82 = pauVar82 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }